

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<bool_const&,bool_const&,bool_const&,pstd::optional<int>const&,pstd::optional<int>const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&,pstd::optional<pbrt::Point2<int>>const&,float_const&>
               (string *s,char *fmt,bool *v,bool *args,bool *args_1,optional<int> *args_2,
               optional<int> *args_3,bool *args_4,bool *args_5,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_6,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_7,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_8,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_9,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_10,
               optional<pbrt::Bounds2<float>_> *args_11,optional<pbrt::Bounds2<int>_> *args_12,
               optional<pbrt::Point2<int>_> *args_13,float *args_14)

{
  long lVar1;
  ulong uVar2;
  byte *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_RBP;
  char *pcVar3;
  string *in_RDI;
  string *in_R9;
  bool *unaff_R13;
  bool *unaff_R14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_R15;
  byte bVar4;
  byte bVar5;
  undefined1 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  string *in_stack_00000018;
  optional<pbrt::Bounds2<int>_> *in_stack_00000020;
  string *in_stack_00000028;
  float *in_stack_00000030;
  optional<int> *in_stack_00000038;
  optional<int> *in_stack_00000040;
  bool *in_stack_00000048;
  bool *in_stack_00000050;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000058;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000060;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  string *in_stack_fffffffffffffcb0;
  char **in_stack_fffffffffffffcb8;
  char **in_stack_fffffffffffffcc0;
  char *in_stack_fffffffffffffcc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  optional<pbrt::Bounds2<float>_> *in_stack_fffffffffffffd08;
  optional<pbrt::Bounds2<int>_> *in_stack_fffffffffffffd10;
  optional<pbrt::Point2<int>_> *in_stack_fffffffffffffd18;
  float *in_stack_fffffffffffffd20;
  undefined1 *puVar7;
  char *in_stack_fffffffffffffd38;
  undefined8 in_stack_fffffffffffffd40;
  int line;
  char *in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd50;
  LogLevel level;
  string local_2a8 [32];
  string local_288 [32];
  undefined8 local_268;
  string local_260 [32];
  stringstream local_240 [16];
  undefined1 local_230 [376];
  string local_b8 [32];
  undefined4 local_98;
  undefined5 in_stack_ffffffffffffff78;
  optional<int> *in_stack_ffffffffffffff80;
  bool *in_stack_ffffffffffffff88;
  bool *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  
  level = (LogLevel)((ulong)in_stack_fffffffffffffd50 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffffd40 >> 0x20);
  copyToFormatString(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffff80,0x2a);
  bVar4 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffff80,0x73);
  bVar5 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)&stack0xffffffffffffff80,100);
  uVar6 = lVar1 != -1;
  if ((bVar4 & 1) == 0) {
    if ((bVar5 & 1) == 0) {
      if ((bool)uVar6) {
        puVar7 = &stack0xffffffffffffff80;
        uVar2 = std::__cxx11::string::find((char)puVar7,100);
        IntegerFormatTrait<bool>::fmt();
        std::__cxx11::string::replace((ulong)puVar7,uVar2,(char *)0x1);
        std::__cxx11::string::c_str();
        formatOne<bool_const&>(in_stack_fffffffffffffcc8,(bool *)in_stack_fffffffffffffcc0);
        std::__cxx11::string::operator+=(in_RDI,local_b8);
        std::__cxx11::string::~string(local_b8);
      }
      else if ((bVar5 & 1) == 0) {
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) != 0) {
          LogFatal(level,in_stack_fffffffffffffd48,line,in_stack_fffffffffffffd38);
        }
        std::__cxx11::string::c_str();
        formatOne<bool_const&>(in_stack_fffffffffffffcc8,(bool *)in_stack_fffffffffffffcc0);
        std::__cxx11::string::operator+=(in_RDI,local_2a8);
        std::__cxx11::string::~string(local_2a8);
      }
      else {
        std::__cxx11::stringstream::stringstream(local_240);
        std::ostream::operator<<(local_230,(bool)(*in_RDX & 1));
        std::__cxx11::string::c_str();
        std::__cxx11::stringstream::str();
        local_268 = std::__cxx11::string::c_str();
        formatOne<char_const*>(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
        std::__cxx11::string::operator+=(in_RDI,local_260);
        std::__cxx11::string::~string(local_260);
        std::__cxx11::string::~string(local_288);
        std::__cxx11::stringstream::~stringstream(local_240);
      }
    }
    else {
      pcVar3 = "false";
      if ((*in_RDX & 1) != 0) {
        pcVar3 = "true";
      }
      std::__cxx11::string::operator+=(in_RDI,pcVar3);
    }
    stringPrintfRecursive<bool_const&,bool_const&,pstd::optional<int>const&,pstd::optional<int>const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&,pstd::optional<pbrt::Point2<int>>const&,float_const&>
              (in_R9,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80,
               (optional<int> *)
               CONCAT17(bVar4,CONCAT16(bVar5,CONCAT15(uVar6,in_stack_ffffffffffffff78))),unaff_R13,
               unaff_R14,unaff_R15,unaff_RBP,unaff_retaddr,in_stack_00000008,in_stack_00000010,
               (optional<pbrt::Bounds2<float>_> *)in_stack_00000018,in_stack_00000020,
               (optional<pbrt::Point2<int>_> *)in_stack_00000028,in_stack_00000030);
    local_98 = 0;
  }
  else {
    stringPrintfRecursiveWithPrecision<bool_const&,bool_const&,bool_const&,pstd::optional<int>const&,pstd::optional<int>const&,bool_const&,bool_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,pstd::optional<pbrt::Bounds2<float>>const&,pstd::optional<pbrt::Bounds2<int>>const&,pstd::optional<pbrt::Point2<int>>const&,float_const&>
              (in_stack_00000028,(char *)in_stack_00000020,in_stack_00000018,
               (bool *)in_stack_00000010,(bool *)in_stack_00000008,(bool *)in_R9,in_stack_00000038,
               in_stack_00000040,in_stack_00000048,in_stack_00000050,in_stack_00000058,
               in_stack_00000060,in_stack_fffffffffffffcf0,in_stack_fffffffffffffcf8,
               in_stack_fffffffffffffd00,in_stack_fffffffffffffd08,in_stack_fffffffffffffd10,
               in_stack_fffffffffffffd18,in_stack_fffffffffffffd20);
    local_98 = 1;
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&...args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same_v<std::decay_t<T>, float>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, double>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, bool>)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}